

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_f32__ima(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_uint64 dVar2;
  float *local_1040;
  drwav_uint64 samplesRead;
  drwav_int16 samples16 [2048];
  drwav_uint64 totalSamplesRead;
  float *pBufferOut_local;
  drwav_uint64 samplesToRead_local;
  drwav *pWav_local;
  
  samples16[0x7fc] = 0;
  samples16[0x7fd] = 0;
  samples16[0x7fe] = 0;
  samples16[0x7ff] = 0;
  totalSamplesRead = (drwav_uint64)pBufferOut;
  pBufferOut_local = (float *)samplesToRead;
  while( true ) {
    if (pBufferOut_local == (float *)0x0) {
      dVar2._0_2_ = samples16[0x7fc];
      dVar2._2_2_ = samples16[0x7fd];
      dVar2._4_2_ = samples16[0x7fe];
      dVar2._6_2_ = samples16[0x7ff];
      return dVar2;
    }
    if (pBufferOut_local < (float *)0x800) {
      local_1040 = pBufferOut_local;
    }
    else {
      local_1040 = (float *)0x800;
    }
    dVar1 = drwav_read_s16(pWav,(drwav_uint64)local_1040,(drwav_int16 *)&samplesRead);
    if (dVar1 == 0) break;
    drwav_s16_to_f32((float *)totalSamplesRead,(drwav_int16 *)&samplesRead,dVar1);
    totalSamplesRead = dVar1 * 4 + totalSamplesRead;
    pBufferOut_local = (float *)((long)pBufferOut_local - dVar1);
    samples16._4088_8_ = dVar1 + samples16._4088_8_;
  }
  dVar1._0_2_ = samples16[0x7fc];
  dVar1._2_2_ = samples16[0x7fd];
  dVar1._4_2_ = samples16[0x7fe];
  dVar1._6_2_ = samples16[0x7ff];
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_f32__ima(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    // We're just going to borrow the implementation from the drwav_read_s16() since IMA-ADPCM is a little bit more
    // complicated than other formats and I don't want to duplicate that code.
    drwav_uint64 totalSamplesRead = 0;
    drwav_int16 samples16[2048];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read_s16(pWav, drwav_min(samplesToRead, 2048), samples16);
        if (samplesRead == 0) {
            break;
        }

        drwav_s16_to_f32(pBufferOut, samples16, (size_t)samplesRead);  // <-- Safe cast because we're clamping to 2048.

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}